

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server2.cpp
# Opt level: O2

void threadFunc(int id,int new_fd,bool *finished,bool *msgFlags,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *msgs,vector<cUser,_std::allocator<cUser>_> *currUsers)

{
  anon_struct_40_2_6a8bb0e8 *paVar1;
  pointer paVar2;
  __type _Var3;
  bool bVar4;
  int iVar5;
  string *psVar6;
  ssize_t sVar7;
  ostream *poVar8;
  long lVar9;
  string *unaff_R12;
  long lVar10;
  __normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_> __position;
  __normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_> _Var11;
  pointer paVar12;
  string local_190;
  string local_170;
  string local_150;
  string local_130 [32];
  pollfd local_110;
  undefined8 local_108;
  undefined1 local_100 [8];
  size_type sStack_f8;
  undefined1 local_f0 [8];
  string currUser;
  pollfd local_c8;
  undefined8 local_c0;
  undefined1 local_b8;
  uint7 uStack_b7;
  size_type sStack_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  pollfd local_88;
  pollfd pollData [1];
  cUser user;
  
  local_f0 = (undefined1  [8])&currUser._M_string_length;
  currUser._M_dataplus._M_p = (pointer)0x0;
  currUser._M_string_length._0_1_ = 0;
  local_88.events = 1;
  currUser.field_2._8_8_ = SEXT48(id);
  bVar4 = false;
  lVar9 = currUser.field_2._8_8_ * 0x20;
  local_88.fd = new_fd;
  user._32_8_ = msgs;
LAB_001059cd:
  if (!bVar4) {
    sVar7 = send(new_fd,"Use Command Login To Login:",0x1c,0);
    if (sVar7 == -1) {
      perror("send");
    }
    unaff_R12 = getCommand_abi_cxx11_(new_fd,&local_88,msgFlags,id);
    if (unaff_R12 != (string *)0x0) {
      std::__cxx11::string::string((string *)pollData,"login",(allocator *)&local_a8);
      _Var3 = std::operator==(unaff_R12,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              pollData);
      if (_Var3) goto code_r0x00105ac2;
      std::__cxx11::string::~string((string *)pollData);
      goto LAB_00105b92;
    }
    poVar8 = std::operator<<((ostream *)&std::cout,"connection with host lost");
    std::endl<char,std::char_traits<char>>(poVar8);
    goto LAB_00105d4c;
  }
  psVar6 = getCommand_abi_cxx11_(new_fd,&local_88,msgFlags,id);
  if (psVar6 == (string *)0x0) {
    poVar8 = std::operator<<((ostream *)&std::cout,"Client connection lost");
    std::endl<char,std::char_traits<char>>(poVar8);
    goto LAB_00105cfc;
  }
  std::__cxx11::string::string((string *)pollData,"newuser",(allocator *)&local_a8);
  _Var3 = std::operator==(psVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)pollData);
  std::__cxx11::string::~string((string *)pollData);
  if (_Var3) {
    std::__cxx11::string::string((string *)&local_170,(string *)(psVar6 + 1));
    psVar6 = &local_170;
    newUser(psVar6,new_fd);
LAB_00105a4d:
    std::__cxx11::string::~string((string *)psVar6);
    bVar4 = true;
    goto LAB_001059cd;
  }
  std::__cxx11::string::string((string *)pollData,"msg",(allocator *)&local_a8);
  _Var3 = std::operator==(psVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)pollData);
  std::__cxx11::string::~string((string *)pollData);
  if (_Var3) {
    sVar7 = send(new_fd,*(void **)(*(long *)user._32_8_ + lVar9),0xff,0);
    if (sVar7 == -1) {
      perror("send error");
    }
    msgFlags[currUser.field_2._8_8_] = false;
    bVar4 = true;
    goto LAB_001059cd;
  }
  std::__cxx11::string::string((string *)pollData,"who",(allocator *)&local_a8);
  _Var3 = std::operator==(psVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)pollData);
  std::__cxx11::string::~string((string *)pollData);
  if (_Var3) {
    bVar4 = true;
    who(currUsers,new_fd);
    goto LAB_001059cd;
  }
  std::__cxx11::string::string((string *)pollData,"send",(allocator *)&local_a8);
  _Var3 = std::operator==(psVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)pollData);
  std::__cxx11::string::~string((string *)pollData);
  if (_Var3) {
    std::__cxx11::string::string((string *)&local_150,(string *)(psVar6 + 1));
    psVar6 = &local_150;
    sendMessage(psVar6,new_fd,(string *)local_f0,currUsers,msgFlags,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)user._32_8_);
    goto LAB_00105a4d;
  }
  std::__cxx11::string::string((string *)pollData,"logout",(allocator *)&local_a8);
  _Var3 = std::operator==(psVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)pollData);
  std::__cxx11::string::~string((string *)pollData);
  if (!_Var3) {
    sVar7 = send(new_fd,"Invalid Command",0x14,0);
    bVar4 = true;
    if (sVar7 == -1) {
      perror("send");
    }
    goto LAB_001059cd;
  }
  sVar7 = send(new_fd,"You are now loged out",0x19,0);
  if (sVar7 == -1) {
    perror("send");
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pollData,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                 " logout.");
  poVar8 = std::operator<<((ostream *)&std::cout,(string *)pollData);
  std::endl<char,std::char_traits<char>>(poVar8);
  std::__cxx11::string::~string((string *)pollData);
  _Var11._M_current =
       (currUsers->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
       super__Vector_impl_data._M_start;
  paVar1 = (currUsers->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  std::__cxx11::string::string(local_130,(string *)local_f0);
  std::__cxx11::string::string((string *)&local_c8,local_130);
  local_108 = local_c0;
  pollData[0] = (pollfd)&user.username._M_string_length;
  if (local_c8 == (pollfd)&local_b8) {
    user.username.field_2._M_allocated_capacity = sStack_b0;
    local_c8 = pollData[0];
  }
  local_c0 = 0;
  local_b8 = 0;
  local_110 = local_c8;
  if (local_c8 == pollData[0]) {
    sStack_f8 = user.username.field_2._M_allocated_capacity;
    local_110 = (pollfd)local_100;
  }
  user.username._M_dataplus._M_p = (pointer)0x0;
  user.username._M_string_length = (ulong)uStack_b7 << 8;
  local_c8 = (pollfd)&local_b8;
  std::__cxx11::string::~string((string *)pollData);
  std::__cxx11::string::string((string *)&local_a8,(string *)&local_110);
  std::__cxx11::string::string((string *)pollData,(string *)&local_a8);
  lVar9 = (long)paVar1 - (long)_Var11._M_current;
  for (lVar10 = lVar9 / 0x28 >> 2; 0 < lVar10; lVar10 = lVar10 + -1) {
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::$_0>
            ::operator()((_Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::__0>
                          *)pollData,_Var11);
    __position._M_current = _Var11._M_current;
    if (bVar4) goto LAB_00105f99;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::$_0>
            ::operator()((_Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::__0>
                          *)pollData,_Var11._M_current + 1);
    __position._M_current = _Var11._M_current + 1;
    if (bVar4) goto LAB_00105f99;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::$_0>
            ::operator()((_Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::__0>
                          *)pollData,_Var11._M_current + 2);
    __position._M_current = _Var11._M_current + 2;
    if (bVar4) goto LAB_00105f99;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::$_0>
            ::operator()((_Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::__0>
                          *)pollData,_Var11._M_current + 3);
    __position._M_current = _Var11._M_current + 3;
    if (bVar4) goto LAB_00105f99;
    _Var11._M_current = _Var11._M_current + 4;
    lVar9 = lVar9 + -0xa0;
  }
  lVar9 = lVar9 / 0x28;
  if (lVar9 != 1) {
    if (lVar9 != 2) {
      __position._M_current = paVar1;
      if ((lVar9 != 3) ||
         (bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::$_0>
                  ::operator()((_Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::__0>
                                *)pollData,_Var11), __position._M_current = _Var11._M_current, bVar4
         )) goto LAB_00105f99;
      _Var11._M_current = _Var11._M_current + 1;
    }
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::$_0>
            ::operator()((_Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::__0>
                          *)pollData,_Var11);
    __position._M_current = _Var11._M_current;
    if (bVar4) goto LAB_00105f99;
    _Var11._M_current = _Var11._M_current + 1;
  }
  bVar4 = __gnu_cxx::__ops::
          _Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::$_0>
          ::operator()((_Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::__0>
                        *)pollData,_Var11);
  __position._M_current = _Var11._M_current;
  if (!bVar4) {
    __position._M_current = paVar1;
  }
LAB_00105f99:
  std::__cxx11::string::~string((string *)pollData);
  std::__cxx11::string::~string((string *)&local_a8);
  if (__position._M_current != paVar1) {
    _Var11._M_current = __position._M_current;
    while (_Var11._M_current = _Var11._M_current + 1, _Var11._M_current != paVar1) {
      bVar4 = __gnu_cxx::__ops::
              _Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::$_0>
              ::operator()((_Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::__0>
                            *)&local_110,_Var11);
      if (!bVar4) {
        anon_struct_40_2_6a8bb0e8::operator=(__position._M_current,_Var11._M_current);
        __position._M_current = __position._M_current + 1;
      }
    }
  }
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_c8);
  std::vector<cUser,_std::allocator<cUser>_>::erase(currUsers,(const_iterator)__position._M_current)
  ;
  std::__cxx11::string::~string(local_130);
  paVar2 = (currUsers->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (paVar12 = (currUsers->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
                 super__Vector_impl_data._M_start; paVar12 != paVar2; paVar12 = paVar12 + 1) {
    anon_struct_40_2_6a8bb0e8::cUser((anon_struct_40_2_6a8bb0e8 *)pollData,paVar12);
    std::operator+(&local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                   " left");
    std::__cxx11::string::operator=
              ((string *)((long)(int)user.username.field_2._8_4_ * 0x20 + *(long *)user._32_8_),
               (string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    msgFlags[(int)user.username.field_2._8_4_] = true;
    std::__cxx11::string::~string((string *)pollData);
  }
LAB_00105cfc:
  if (unaff_R12 != (string *)0x0) {
    lVar9 = *(long *)((long)&unaff_R12[-1].field_2 + 8);
    if (lVar9 != 0) {
      lVar9 = lVar9 << 5;
      do {
        std::__cxx11::string::~string((string *)((long)&unaff_R12[-1]._M_dataplus._M_p + lVar9));
        lVar9 = lVar9 + -0x20;
      } while (lVar9 != 0);
    }
    operator_delete__((void *)((long)&unaff_R12[-1].field_2 + 8));
  }
LAB_00105d4c:
  close(new_fd);
  std::__cxx11::string::~string((string *)local_f0);
  return;
code_r0x00105ac2:
  std::__cxx11::string::string((string *)&local_190,(string *)(unaff_R12 + 1));
  iVar5 = login(&local_190,new_fd,(string *)local_f0,currUsers,id,msgFlags,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)user._32_8_);
  std::__cxx11::string::~string((string *)&local_190);
  std::__cxx11::string::~string((string *)pollData);
  bVar4 = true;
  if (iVar5 == 0) {
LAB_00105b92:
    bVar4 = false;
    send(new_fd,"Server: Denied. Please login first.",0x28,0);
  }
  goto LAB_001059cd;
}

Assistant:

void threadFunc(int id,int new_fd, bool* finished,
    bool* msgFlags, vector<string>& msgs, vector<cUser>& currUsers){

    //needed flags for user flow
    bool loginFlag = false;
    bool connectionLost = false;
    char buffer[MAXDATASIZE];
    string* cmd;
    string currUser;
    struct pollfd pollData[1];

    //set up the polling data for the sockets function
    pollData[0].fd = new_fd;
    pollData[0].events = POLLIN;


    while(1){
        //don't let anyone past unless they got that login
        while(!loginFlag){

            //Send login notice
            if (send(new_fd, "Use Command Login To Login:", 28, 0) == -1)
                perror("send");

            //get the users command
            cmd = getCommand(new_fd,pollData,msgFlags,id);

            //if the getCommand function returns null it means connection was lost
            if(cmd == NULL){
                cout << "connection with host lost" << endl;
                connectionLost = true;
                break;
            }

            //if they are all logged in set it all up
            if(cmd[0] == string("login") && login(cmd[1],new_fd,&currUser,currUsers,id, msgFlags, msgs)){
                //add the user to the current users list
                loginFlag = true;
            }
            else{
                send(new_fd, "Server: Denied. Please login first.", 40, 0);
            }
        }

        //make sure connection isn't lost during logins
        if(connectionLost){
            delete[] cmd;
            close(new_fd);
            return;
        }
        //start looping through recieving and sending messages
        if(loginFlag){
            string* cmd = getCommand(new_fd,pollData,msgFlags,id);

            //connection to the socket was lost
            if(cmd == NULL){
                cout << "Client connection lost" << endl;
                break;
            }


            //user flow to activate functions for each command
            if(cmd[0] == string("newuser")){
                newUser(cmd[1],new_fd);
            }
            else if(cmd[0] == string("msg")){
                if(send(new_fd,msgs[id].c_str(),MAXDATASIZE-1,0) == -1)
                    perror("send error");
                msgFlags[id] = false;
            }
            else if (cmd[0] == string("who")){
                who(currUsers,new_fd);
            }
            else if (cmd[0] == string("send")){
                sendMessage(cmd[1], new_fd, currUser, currUsers, msgFlags, msgs);
            }
            else if (cmd[0] == string("logout")){
                if (send(new_fd, "You are now loged out", 25, 0) == -1)
                    perror("send");

                loginFlag = false;

                cout << currUser + " logout." << endl;

                //remove the user from the list of current users
                currUsers.erase(remove_if(currUsers.begin(), currUsers.end(),[currUser](cUser u){
                    return (u.username == currUser);
                }));

                //broadcast the user has joined
                for(cUser user : currUsers){
                    msgs[user.id] = string(currUser + " left");
                    msgFlags[user.id] = true;
                }

                break;

            }
            //catch any other invalid input
            else {
                if(send((new_fd),"Invalid Command",20,0) == -1)
                    perror("send");
            }
        }
    }
    //final clean up
    delete[] cmd;
    close(new_fd);
}